

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesAttGroupInfo.cpp
# Opt level: O1

SchemaAttDef * __thiscall
xercesc_4_0::XercesAttGroupInfo::getAttDef(XercesAttGroupInfo *this,XMLCh *baseName,int uriId)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLSize_t XVar3;
  SchemaAttDef *pSVar4;
  XMLCh *pXVar5;
  XMLCh *pXVar6;
  SchemaAttDef *unaff_R12;
  XMLSize_t getAt;
  bool bVar7;
  
  if ((this->fAttributes != (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) &&
     (XVar3 = (this->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).fCurCount,
     XVar3 != 0)) {
    getAt = 0;
    do {
      pSVar4 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                         (&this->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,getAt
                         );
      if (pSVar4->fAttName->fURIId == uriId) {
        pXVar5 = pSVar4->fAttName->fLocalPart;
        if (pXVar5 != baseName) {
          if ((baseName != (XMLCh *)0x0) && (pXVar6 = baseName, pXVar5 != (XMLCh *)0x0)) {
            do {
              XVar1 = *pXVar6;
              if (XVar1 == L'\0') goto LAB_003424b5;
              XVar2 = *pXVar5;
              pXVar5 = pXVar5 + 1;
              pXVar6 = pXVar6 + 1;
            } while (XVar1 == XVar2);
            goto LAB_003424c7;
          }
          if (baseName == (XMLCh *)0x0) {
            if (pXVar5 == (XMLCh *)0x0) goto LAB_003424c0;
LAB_003424b5:
            bVar7 = *pXVar5 == L'\0';
          }
          else {
            bVar7 = *baseName == L'\0';
            if (bVar7 && pXVar5 != (XMLCh *)0x0) goto LAB_003424b5;
          }
          if (!bVar7) goto LAB_003424c7;
        }
LAB_003424c0:
        bVar7 = false;
      }
      else {
LAB_003424c7:
        bVar7 = true;
        pSVar4 = unaff_R12;
      }
      if (!bVar7) {
        return pSVar4;
      }
      getAt = getAt + 1;
      unaff_R12 = pSVar4;
    } while (getAt != XVar3);
  }
  return (SchemaAttDef *)0x0;
}

Assistant:

const SchemaAttDef* XercesAttGroupInfo::getAttDef(const XMLCh* const baseName,
                                                  const int uriId) const {

    // If no list, then return a null
    if (!fAttributes)
        return 0;

    XMLSize_t attSize = fAttributes->size();

    for (XMLSize_t i=0; i<attSize; i++) {

        const SchemaAttDef* attDef = fAttributes->elementAt(i);
        QName* attName = attDef->getAttName();

        if (uriId == (int) attName->getURI() &&
			XMLString::equals(baseName, attName->getLocalPart())) {

            return attDef;
        }
    }

    return 0;
}